

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O1

void __thiscall QTextHtmlParser::dumpHtml(QTextHtmlParser *this)

{
  char *pcVar1;
  uint uVar2;
  QTextHtmlParserNode *pQVar3;
  QDebug QVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 *puVar7;
  storage_type *psVar8;
  char16_t *pcVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QLatin1String QVar13;
  QArrayData *local_c8;
  undefined8 *local_c0;
  QString local_b0;
  QArrayData *local_98;
  undefined8 *local_90;
  undefined4 local_80;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined4 local_6c;
  char *local_68;
  QDebug local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (0 < (int)(this->nodes).d.size) {
    uVar10 = 0;
    do {
      local_80 = 2;
      local_7c = 0;
      uStack_74 = 0;
      local_6c = 0;
      local_68 = "default";
      QMessageLogger::debug();
      (local_60.stream)->space = false;
      if (uVar10 == 0) {
        uVar6 = 0;
      }
      else {
        uVar5 = 0;
        uVar6 = uVar10 & 0xffffffff;
        do {
          uVar2 = (this->nodes).d.ptr[(int)uVar6]->parent;
          uVar6 = (ulong)uVar2;
          uVar5 = uVar5 + 4;
        } while (uVar2 != 0);
        uVar6 = (ulong)uVar5;
      }
      QString::QString(&local_b0,uVar6,(QChar)0x20);
      QString::toLocal8Bit_helper((QChar *)&local_98,(longlong)local_b0.d.ptr);
      QVar4.stream = local_60.stream;
      puVar7 = local_90;
      if (local_90 == (undefined8 *)0x0) {
        puVar7 = &QByteArray::_empty;
      }
      psVar8 = (storage_type *)0xffffffffffffffff;
      do {
        pcVar1 = psVar8 + (long)puVar7 + 1;
        psVar8 = psVar8 + 1;
      } while (*pcVar1 != '\0');
      QVar11.m_data = psVar8;
      QVar11.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar11);
      QTextStream::operator<<(&(QVar4.stream)->ts,&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((local_60.stream)->space == true) {
        QTextStream::operator<<(&(local_60.stream)->ts,' ');
      }
      QString::toLocal8Bit_helper
                ((QChar *)&local_c8,(longlong)((this->nodes).d.ptr[uVar10]->tag).d.ptr);
      QVar4.stream = local_60.stream;
      puVar7 = local_c0;
      if (local_c0 == (undefined8 *)0x0) {
        puVar7 = &QByteArray::_empty;
      }
      psVar8 = (storage_type *)0xffffffffffffffff;
      do {
        pcVar1 = psVar8 + (long)puVar7 + 1;
        psVar8 = psVar8 + 1;
      } while (*pcVar1 != '\0');
      QVar12.m_data = psVar8;
      QVar12.m_size = (qsizetype)&local_58;
      QString::fromUtf8(QVar12);
      QTextStream::operator<<(&(QVar4.stream)->ts,&local_58);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((local_60.stream)->space == true) {
        QTextStream::operator<<(&(local_60.stream)->ts,' ');
      }
      QTextStream::operator<<(&(local_60.stream)->ts,':');
      if ((local_60.stream)->space == true) {
        QTextStream::operator<<(&(local_60.stream)->ts,' ');
      }
      pQVar3 = (this->nodes).d.ptr[uVar10];
      local_58.d.d = (pQVar3->text).d.d;
      local_58.d.ptr = (pQVar3->text).d.ptr;
      local_58.d.size = (pQVar3->text).d.size;
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QVar13.m_data = (char *)0x2;
      QVar13.m_size = 10;
      QString::replace((QChar)(char16_t)&local_58,QVar13,0x6bf9fd);
      pcVar9 = local_58.d.ptr;
      if (local_58.d.ptr == (char16_t *)0x0) {
        pcVar9 = (char16_t *)&QString::_empty;
      }
      QDebug::putString((QChar *)&local_60,(ulong)pcVar9);
      if ((local_60.stream)->space == true) {
        QTextStream::operator<<(&(local_60.stream)->ts,' ');
      }
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_c8 != (QArrayData *)0x0) {
        LOCK();
        (local_c8->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_c8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_c8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_c8,1,0x10);
        }
      }
      if (local_98 != (QArrayData *)0x0) {
        LOCK();
        (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_98,1,0x10);
        }
      }
      if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
        }
      }
      QDebug::~QDebug(&local_60);
      uVar10 = uVar10 + 1;
    } while ((long)uVar10 < (long)(int)(this->nodes).d.size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextHtmlParser::dumpHtml()
{
    for (int i = 0; i < count(); ++i) {
        qDebug().nospace() << qPrintable(QString(depth(i) * 4, u' '))
                           << qPrintable(at(i).tag) << ':'
                           << quoteNewline(at(i).text);
    }
}